

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall Omega_h::fabs_each(Omega_h *this,Read<double> *a)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  uint uVar3;
  size_t sVar4;
  Read<double> RVar5;
  Write<double> b;
  type f;
  Write<double> local_a0;
  string local_90;
  Write<signed_char> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  Write<double> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_60);
  Write<double>::Write(&local_a0,(LO)(sVar4 >> 3),&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Write<double>::Write(&local_40,&local_a0);
  Write<double>::Write(&local_30,&a->write_);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  Write<double>::Write(&local_60,&local_40);
  Write<double>::Write(&local_50,&local_30);
  uVar3 = (uint)(sVar4 >> 3);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<double>::Write((Write<signed_char> *)&local_90,(Write<signed_char> *)&local_60);
    Write<double>::Write((Write<signed_char> *)&local_90.field_2,(Write<signed_char> *)&local_50);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(ulong *)(local_90._M_string_length + uVar2 * 8) =
           *(ulong *)(local_90.field_2._8_8_ + uVar2 * 8) & 0x7fffffffffffffff;
    }
    fabs_each(Omega_h::Read<double>)::$_0::~__0((__0 *)&local_90);
  }
  fabs_each(Omega_h::Read<double>)::$_0::~__0((__0 *)&local_60);
  Write<double>::Write(&local_70,(Write<signed_char> *)&local_a0);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_70);
  Write<double>::~Write((Write<double> *)&local_70);
  fabs_each(Omega_h::Read<double>)::$_0::~__0((__0 *)&local_40);
  Write<double>::~Write(&local_a0);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<Real> fabs_each(Read<Real> a) {
  Write<Real> b(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = std::abs(a[i]); };
  parallel_for(a.size(), f, "fabs_each");
  return b;
}